

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O3

void __thiscall smf::MidiEventList::clear(MidiEventList *this)

{
  MidiEvent *this_00;
  pointer ppMVar1;
  pointer ppMVar2;
  long lVar3;
  
  ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppMVar2 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppMVar2 - (long)ppMVar1) >> 3)) {
    lVar3 = 0;
    do {
      this_00 = ppMVar1[lVar3];
      if (this_00 != (MidiEvent *)0x0) {
        MidiEvent::~MidiEvent(this_00);
        operator_delete(this_00);
        (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl
        .super__Vector_impl_data._M_start[lVar3] = (MidiEvent *)0x0;
        ppMVar1 = (this->list).
                  super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppMVar2 = (this->list).
                  super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)((ulong)((long)ppMVar2 - (long)ppMVar1) >> 3));
  }
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::resize(&this->list,0);
  return;
}

Assistant:

void MidiEventList::clear(void) {
	for (int i=0; i<(int)list.size(); i++) {
		if (list[i] != NULL) {
			delete list[i];
			list[i] = NULL;
		}
	}
	list.resize(0);
}